

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O2

int __thiscall QDialPrivate::bound(QDialPrivate *this,int val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((this->field_0x298 & 2) == 0) {
    iVar3 = *(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
    iVar1 = (this->super_QAbstractSliderPrivate).maximum;
    if (iVar1 < val) {
      val = iVar1;
    }
    if (val < iVar3) {
      val = iVar3;
    }
  }
  else {
    iVar3 = *(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
    iVar1 = (this->super_QAbstractSliderPrivate).maximum;
    if (iVar1 < val || val < iVar3) {
      if (iVar1 - iVar3 != 0) {
        iVar2 = (val - iVar3) % (iVar1 - iVar3);
        if (iVar2 < 0) {
          iVar3 = iVar1;
        }
        iVar3 = iVar3 + iVar2;
      }
      return iVar3;
    }
  }
  return val;
}

Assistant:

int QDialPrivate::bound(int val) const
{
    if (wrapping) {
        if ((val >= minimum) && (val <= maximum))
            return val;
        if (minimum == maximum)
            return minimum;
        val = minimum + ((val - minimum) % (maximum - minimum));
        if (val < minimum)
            val += maximum - minimum;
        return val;
    } else {
        return QAbstractSliderPrivate::bound(val);
    }
}